

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionObject.cpp
# Opt level: O2

char * __thiscall
btCollisionObject::serialize(btCollisionObject *this,void *dataBuffer,btSerializer *serializer)

{
  btScalar bVar1;
  btScalar bVar2;
  btScalar bVar3;
  undefined8 uVar4;
  long lVar5;
  
  btTransform::serialize(&this->m_worldTransform,(btTransformFloatData *)((long)dataBuffer + 0x20));
  btTransform::serialize
            (&this->m_interpolationWorldTransform,(btTransformFloatData *)((long)dataBuffer + 0x60))
  ;
  btVector3::serialize
            (&this->m_interpolationLinearVelocity,(btVector3FloatData *)((long)dataBuffer + 0xa0));
  btVector3::serialize
            (&this->m_interpolationAngularVelocity,(btVector3FloatData *)((long)dataBuffer + 0xb0));
  btVector3::serialize(&this->m_anisotropicFriction,(btVector3FloatData *)((long)dataBuffer + 0xc0))
  ;
  *(int *)((long)dataBuffer + 0xf0) = this->m_hasAnisotropicFriction;
  *(btScalar *)((long)dataBuffer + 0xd0) = this->m_contactProcessingThreshold;
  *(undefined8 *)dataBuffer = 0;
  uVar4 = (**(code **)(*(long *)serializer + 0x38))(serializer,this->m_collisionShape);
  *(undefined8 *)((long)dataBuffer + 8) = uVar4;
  *(undefined8 *)((long)dataBuffer + 0x10) = 0;
  uVar4 = *(undefined8 *)&this->m_companionId;
  *(undefined8 *)((long)dataBuffer + 0xf4) = *(undefined8 *)&this->m_collisionFlags;
  *(undefined8 *)((long)dataBuffer + 0xfc) = uVar4;
  bVar1 = this->m_friction;
  bVar2 = this->m_restitution;
  bVar3 = this->m_rollingFriction;
  *(btScalar *)((long)dataBuffer + 0xd4) = this->m_deactivationTime;
  *(btScalar *)((long)dataBuffer + 0xd8) = bVar1;
  *(btScalar *)((long)dataBuffer + 0xdc) = bVar3;
  *(btScalar *)((long)dataBuffer + 0xe0) = bVar2;
  *(int *)((long)dataBuffer + 0x104) = this->m_internalType;
  uVar4 = (**(code **)(*(long *)serializer + 0x50))(serializer,this);
  lVar5 = (**(code **)(*(long *)serializer + 0x38))(serializer,uVar4);
  *(long *)((long)dataBuffer + 0x18) = lVar5;
  if (lVar5 != 0) {
    (**(code **)(*(long *)serializer + 0x60))(serializer,uVar4);
  }
  *(undefined8 *)((long)dataBuffer + 0xe4) = *(undefined8 *)&this->m_hitFraction;
  *(btScalar *)((long)dataBuffer + 0xec) = this->m_ccdMotionThreshold;
  *(int *)((long)dataBuffer + 0x108) = this->m_checkCollideWith;
  return "btCollisionObjectFloatData";
}

Assistant:

const char* btCollisionObject::serialize(void* dataBuffer, btSerializer* serializer) const
{

	btCollisionObjectData* dataOut = (btCollisionObjectData*)dataBuffer;

	m_worldTransform.serialize(dataOut->m_worldTransform);
	m_interpolationWorldTransform.serialize(dataOut->m_interpolationWorldTransform);
	m_interpolationLinearVelocity.serialize(dataOut->m_interpolationLinearVelocity);
	m_interpolationAngularVelocity.serialize(dataOut->m_interpolationAngularVelocity);
	m_anisotropicFriction.serialize(dataOut->m_anisotropicFriction);
	dataOut->m_hasAnisotropicFriction = m_hasAnisotropicFriction;
	dataOut->m_contactProcessingThreshold = m_contactProcessingThreshold;
	dataOut->m_broadphaseHandle = 0;
	dataOut->m_collisionShape = serializer->getUniquePointer(m_collisionShape);
	dataOut->m_rootCollisionShape = 0;//@todo
	dataOut->m_collisionFlags = m_collisionFlags;
	dataOut->m_islandTag1 = m_islandTag1;
	dataOut->m_companionId = m_companionId;
	dataOut->m_activationState1 = m_activationState1;
	dataOut->m_deactivationTime = m_deactivationTime;
	dataOut->m_friction = m_friction;
	dataOut->m_rollingFriction = m_rollingFriction;
	dataOut->m_restitution = m_restitution;
	dataOut->m_internalType = m_internalType;
	
	char* name = (char*) serializer->findNameForPointer(this);
	dataOut->m_name = (char*)serializer->getUniquePointer(name);
	if (dataOut->m_name)
	{
		serializer->serializeName(name);
	}
	dataOut->m_hitFraction = m_hitFraction;
	dataOut->m_ccdSweptSphereRadius = m_ccdSweptSphereRadius;
	dataOut->m_ccdMotionThreshold = m_ccdMotionThreshold;
	dataOut->m_checkCollideWith = m_checkCollideWith;

	return btCollisionObjectDataName;
}